

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

int ON_Get3dConvexHull(ON_SimpleArray<ON_3dPoint> *points,ON_SimpleArray<ON_PlaneEquation> *hull)

{
  size_t new_capacity;
  uint uVar1;
  ON_3dPoint *pOVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  double *pdVar6;
  ON_PlaneEquation *pOVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  ON_PlaneEquation e;
  ON_PlaneEquation local_148;
  double local_128;
  undefined8 uStack_120;
  double local_118;
  double local_110;
  double local_108;
  ulong local_100;
  long local_f8;
  long local_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  size_t local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  uVar1 = points->m_count;
  uVar9 = (ulong)(int)uVar1;
  iVar4 = 0;
  if (2 < (long)uVar9) {
    local_f0 = (long)hull->m_count;
    new_capacity = local_f0 + 4;
    if ((uint)hull->m_capacity < (uint)new_capacity) {
      ON_SimpleArray<ON_PlaneEquation>::SetCapacity(hull,new_capacity);
    }
    local_c8 = new_capacity;
    ON_PlaneEquation::ON_PlaneEquation(&local_148);
    local_c0 = 1;
    if (1 < (int)uVar1) {
      local_c0 = (ulong)uVar1;
    }
    local_f8 = 2;
    local_100 = 1;
    local_b8 = 0;
    do {
      uVar8 = local_b8 + 1;
      if (uVar8 < uVar9) {
        pOVar2 = points->m_a;
        local_108 = pOVar2[local_b8].x;
        local_110 = pOVar2[local_b8].y;
        local_118 = pOVar2[local_b8].z;
        uVar5 = local_100;
        lVar11 = local_f8;
        local_b8 = uVar8;
        do {
          local_b0 = uVar5 + 1;
          if ((int)local_b0 < (int)uVar1) {
            pOVar2 = points->m_a;
            local_98 = pOVar2[uVar5].x;
            local_a0 = pOVar2[uVar5].y;
            local_a8 = pOVar2[uVar5].z;
            local_80 = local_98 - local_108;
            local_88 = local_a0 - local_110;
            local_90 = local_a8 - local_118;
            lVar10 = lVar11;
            do {
              pOVar2 = points->m_a;
              local_d8 = pOVar2[lVar10].x;
              local_e8 = pOVar2[lVar10].y;
              local_128 = pOVar2[lVar10].z;
              ON_3dVector::ON_3dVector(&local_60,local_80,local_88,local_90);
              ON_3dVector::ON_3dVector
                        (&local_78,local_d8 - local_108,local_e8 - local_110,local_128 - local_118);
              ON_3dVector::ON_3dVector
                        (&local_48,local_60.y * local_78.z - local_60.z * local_78.y,
                         local_60.z * local_78.x - local_78.z * local_60.x,
                         local_60.x * local_78.y - local_60.y * local_78.x);
              local_148.z = local_48.z;
              local_148.x = local_48.x;
              local_148.y = local_48.y;
              bVar3 = ON_3dVector::Unitize((ON_3dVector *)&local_148);
              iVar4 = 10;
              if (bVar3) {
                dVar12 = local_118 * local_148.z + local_108 * local_148.x + local_110 * local_148.y
                ;
                local_148.d = -dVar12;
                dVar14 = dVar12 - dVar12;
                dVar13 = (local_148.z * local_a8 + local_148.x * local_98 + local_a0 * local_148.y)
                         - dVar12;
                dVar16 = dVar13;
                if ((dVar13 < dVar14) || (dVar16 = dVar14, dVar13 <= dVar14)) {
                  dVar13 = dVar14;
                  dVar14 = dVar16;
                }
                dVar15 = (local_128 * local_148.z + local_d8 * local_148.x + local_e8 * local_148.y)
                         - dVar12;
                dVar16 = dVar15;
                if ((dVar15 < dVar14) || (dVar16 = dVar14, dVar15 <= dVar13)) {
                  dVar14 = dVar16;
                  dVar15 = dVar13;
                }
                dVar13 = -2.3283064365386963e-10;
                if (dVar14 <= -2.3283064365386963e-10) {
                  dVar13 = dVar14;
                }
                dVar14 = 2.3283064365386963e-10;
                if (2.3283064365386963e-10 <= dVar15) {
                  dVar14 = dVar15;
                }
                pdVar6 = &points->m_a->z;
                dVar16 = 0.0;
                bVar3 = true;
                uVar8 = 1;
                local_128 = 0.0;
                do {
                  dVar15 = (*pdVar6 * local_148.z +
                           ((ON_3dPoint *)(pdVar6 + -2))->x * local_148.x + pdVar6[-1] * local_148.y
                           ) - dVar12;
                  if (local_128 <= dVar15) {
                    if (dVar16 < dVar15) {
                      bVar3 = dVar15 <= dVar14 || dVar13 <= local_128;
                      dVar16 = dVar15;
                    }
                  }
                  else {
                    bVar3 = dVar13 <= dVar15 || dVar16 <= dVar14;
                    local_128 = dVar15;
                  }
                  if (uVar9 <= uVar8) break;
                  pdVar6 = pdVar6 + 3;
                  uVar8 = uVar8 + 1;
                } while (bVar3);
                if (bVar3) {
                  if (dVar16 <= dVar14) {
                    uStack_e0 = 0;
                    uStack_d0 = 0;
                    uStack_120 = 0;
                    local_e8 = dVar16;
                    local_d8 = dVar13;
                    if (dVar13 <= local_128) {
                      iVar4 = (int)local_f0;
                      if ((-1 < iVar4) && (iVar4 <= hull->m_capacity)) {
                        hull->m_count = iVar4;
                      }
                      pOVar7 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(hull);
                      pOVar7->x = -local_148.x;
                      pOVar7->y = -local_148.y;
                      pOVar7->z = -local_148.z;
                      pOVar7->d = -(local_148.d - local_128);
                    }
                    pOVar7 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(hull);
                    pOVar7->x = local_148.x;
                    pOVar7->y = local_148.y;
                    pOVar7->z = local_148.z;
                    pOVar7->d = local_148.d - local_e8;
                    iVar4 = 1;
                    if (local_d8 <= local_128) goto LAB_00587b90;
                  }
                  else if (dVar13 <= local_128) {
                    uStack_120 = 0;
                    pOVar7 = ON_SimpleArray<ON_PlaneEquation>::AppendNew(hull);
                    pOVar7->x = -local_148.x;
                    pOVar7->y = -local_148.y;
                    pOVar7->z = -local_148.z;
                    pOVar7->d = -(local_148.d - local_128);
                  }
                }
                iVar4 = 0;
              }
LAB_00587b90:
              if ((iVar4 != 10) && (iVar4 != 0)) {
                return 2;
              }
              lVar10 = lVar10 + 1;
            } while ((int)lVar10 < (int)uVar1);
          }
          lVar11 = lVar11 + 1;
          uVar5 = local_b0;
          uVar8 = local_b8;
        } while (local_b0 != uVar9);
      }
      local_b8 = uVar8;
      local_f8 = local_f8 + 1;
      local_100 = local_100 + 1;
    } while (local_b8 != local_c0);
    iVar4 = (int)local_f0;
    if (((hull->m_count < (int)local_c8) && (-1 < iVar4)) && (iVar4 <= hull->m_capacity)) {
      hull->m_count = iVar4;
    }
    iVar4 = hull->m_count - iVar4;
  }
  return iVar4;
}

Assistant:

bool ON_2fVector::IsUnset() const
{
  return Internal_IsUnsetFloat(2, &x);
}